

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

Frag __thiscall duckdb_re2::Compiler::EmptyWidth(Compiler *this,EmptyOp empty)

{
  long lVar1;
  uint uVar2;
  undefined8 uVar3;
  ulong uVar4;
  Frag FVar5;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  int iStack_34;
  
  uVar2 = AllocInst(this,1);
  if ((int)uVar2 < 0) {
    uVar3 = 0;
    uStack_38 = 0;
    iStack_34 = (uint)iStack_34._1_3_ << 8;
  }
  else {
    uVar4 = (ulong)uVar2;
    Prog::Inst::InitEmptyWidth
              ((this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl + uVar4,empty,0)
    ;
    lVar1 = (uVar4 << 0x21) + uVar4 * 2;
    uStack_3c = (undefined4)lVar1;
    uStack_38 = (undefined4)((ulong)lVar1 >> 0x20);
    iStack_34 = CONCAT31(iStack_34._1_3_,1);
    uVar3 = CONCAT44(uStack_3c,uVar2);
  }
  FVar5._12_4_ = iStack_34;
  FVar5.end.tail = uStack_38;
  FVar5.begin = (int)uVar3;
  FVar5.end.head = (int)((ulong)uVar3 >> 0x20);
  return FVar5;
}

Assistant:

Frag Compiler::EmptyWidth(EmptyOp empty) {
  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  inst_[id].InitEmptyWidth(empty, 0);
  return Frag(id, PatchList::Mk(id << 1), true);
}